

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O0

void __thiscall
BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test::TestBody
          (BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  size_t sVar4;
  pointer pFVar5;
  char *pcVar6;
  raw_ostream *prVar7;
  reference pbVar8;
  long lVar9;
  char *in_R9;
  StringRef name;
  string local_c90;
  AssertHelper local_c70;
  Message local_c68;
  undefined1 local_c60 [8];
  AssertionResult gtest_ar__3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> message;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_3;
  undefined1 local_bf8 [7];
  bool found;
  AssertHelper local_bd8;
  Message local_bd0;
  bool local_bc1;
  undefined1 local_bc0 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_b90 [8];
  Optional<llbuild::buildsystem::BuildValue> result;
  AssertHelper local_af8;
  Message local_af0;
  undefined1 local_ae8 [8];
  AssertionResult gtest_ar__1;
  bool local_ac1;
  undefined1 auStack_ac0 [7];
  bool loadingResult;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_ab0
  ;
  BuildSystem local_aa8;
  BuildSystem system;
  MockBuildSystemDelegate delegate;
  undefined1 local_a10 [8];
  BuildKey keyToBuild;
  undefined1 local_9e0 [8];
  raw_fd_ostream os;
  error_code ec;
  Twine local_968;
  Twine local_950;
  Twine local_938;
  string local_920;
  StringRef local_900;
  undefined1 local_8f0 [8];
  SmallString<256U> manifest;
  string local_7d8;
  AssertHelper local_7b8;
  Message local_7b0;
  StringRef local_7a8;
  string local_798;
  StringRef local_778;
  string local_768;
  bool local_741;
  undefined1 local_740 [8];
  AssertionResult gtest_ar_;
  char *c_2;
  iterator __end1_2;
  iterator __begin1_2;
  SmallString<256U> *__range1_2;
  Twine local_6f8;
  Twine local_6e0;
  Twine local_6c8;
  string local_6b0;
  StringRef local_690;
  undefined1 local_680 [8];
  SmallString<256U> fakeDir;
  char *c_1;
  iterator __end1_1;
  iterator __begin1_1;
  SmallString<256U> *__range1_1;
  Twine local_538;
  Twine local_520;
  Twine local_508;
  string local_4f0;
  StringRef local_4d0;
  undefined1 local_4c0 [8];
  SmallString<256U> outputDir;
  char *c;
  iterator __end1;
  iterator __begin1;
  SmallString<256U> *__range1;
  Twine local_378;
  Twine local_360;
  Twine local_348;
  string local_330;
  StringRef local_310;
  undefined1 local_300 [8];
  SmallString<256U> builddb;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> localFS;
  undefined1 local_1d8 [8];
  TmpDir tempDir;
  BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test *this_local;
  
  tempDir.tempDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
  _248_8_ = this;
  strlen("TestBody");
  llbuild::TmpDir::TmpDir((TmpDir *)local_1d8,_localFS);
  llbuild::basic::createLocalFileSystem();
  llbuild::TmpDir::str_abi_cxx11_(&local_330,(TmpDir *)local_1d8);
  uVar3 = std::__cxx11::string::data();
  local_310.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_310.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_300,local_310);
  std::__cxx11::string::~string((string *)&local_330);
  llvm::Twine::Twine(&local_348,"build.db");
  llvm::Twine::Twine(&local_360,"");
  llvm::Twine::Twine(&local_378,"");
  llvm::Twine::Twine((Twine *)&__range1,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_300,&local_348,&local_360,&local_378,(Twine *)&__range1)
  ;
  __end1 = (iterator)local_300;
  sVar4 = llvm::SmallVectorBase::size((SmallVectorBase *)local_300);
  for (; __end1 != (iterator)((long)local_300 + sVar4); __end1 = __end1 + 1) {
    outputDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_
         = __end1;
    if (*__end1 == '\\') {
      *__end1 = '/';
    }
  }
  llbuild::TmpDir::str_abi_cxx11_(&local_4f0,(TmpDir *)local_1d8);
  uVar3 = std::__cxx11::string::data();
  local_4d0.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_4d0.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_4c0,local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  llvm::Twine::Twine(&local_508,"output");
  llvm::Twine::Twine(&local_520,"");
  llvm::Twine::Twine(&local_538,"");
  llvm::Twine::Twine((Twine *)&__range1_1,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_4c0,&local_508,&local_520,&local_538,
             (Twine *)&__range1_1);
  __end1_1 = (iterator)local_4c0;
  sVar4 = llvm::SmallVectorBase::size((SmallVectorBase *)local_4c0);
  for (; __end1_1 != (iterator)((long)local_4c0 + sVar4); __end1_1 = __end1_1 + 1) {
    fakeDir.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._248_8_ =
         __end1_1;
    if (*__end1_1 == '\\') {
      *__end1_1 = '/';
    }
  }
  llbuild::TmpDir::str_abi_cxx11_(&local_6b0,(TmpDir *)local_1d8);
  uVar3 = std::__cxx11::string::data();
  local_690.Data = (char *)uVar3;
  uVar3 = std::__cxx11::string::length();
  local_690.Length = uVar3;
  llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_680,local_690);
  std::__cxx11::string::~string((string *)&local_6b0);
  llvm::Twine::Twine(&local_6c8,"fake");
  llvm::Twine::Twine(&local_6e0,"");
  llvm::Twine::Twine(&local_6f8,"");
  llvm::Twine::Twine((Twine *)&__range1_2,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)local_680,&local_6c8,&local_6e0,&local_6f8,
             (Twine *)&__range1_2);
  __end1_2 = (iterator)local_680;
  sVar4 = llvm::SmallVectorBase::size((SmallVectorBase *)local_680);
  for (; __end1_2 != (iterator)((long)local_680 + sVar4); __end1_2 = __end1_2 + 1) {
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )__end1_2;
    if (*__end1_2 == '\\') {
      *__end1_2 = '/';
    }
  }
  pFVar5 = std::
           unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ::operator->((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                         *)(builddb.super_SmallVector<char,_256U>.
                            super_SmallVectorStorage<char,_256U>.InlineElts + 0xf8));
  local_778 = llvm::SmallString<256U>::str((SmallString<256U> *)local_680);
  llvm::StringRef::operator_cast_to_string(&local_768,&local_778);
  local_7a8 = llvm::SmallString<256U>::str((SmallString<256U> *)local_4c0);
  llvm::StringRef::operator_cast_to_string(&local_798,&local_7a8);
  iVar2 = (*pFVar5->_vptr_FileSystem[9])(pFVar5,&local_768,&local_798);
  local_741 = (bool)((byte)iVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_740,&local_741,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_798);
  std::__cxx11::string::~string((string *)&local_768);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_740);
  if (!bVar1) {
    testing::Message::Message(&local_7b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7d8,(internal *)local_740,
               (AssertionResult *)"localFS->createSymlink(fakeDir.str(), outputDir.str())","false",
               "true",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7b8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x51b,pcVar6);
    testing::internal::AssertHelper::operator=(&local_7b8,&local_7b0);
    testing::internal::AssertHelper::~AssertHelper(&local_7b8);
    std::__cxx11::string::~string((string *)&local_7d8);
    testing::Message::~Message(&local_7b0);
  }
  manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
  manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].
  super_AlignedCharArray<1UL,_1UL>.buffer[0] =
       (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_740);
  if (manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts._252_4_
      == 0) {
    llbuild::TmpDir::str_abi_cxx11_(&local_920,(TmpDir *)local_1d8);
    uVar3 = std::__cxx11::string::data();
    local_900.Data = (char *)uVar3;
    uVar3 = std::__cxx11::string::length();
    local_900.Length = uVar3;
    llvm::SmallString<256U>::SmallString((SmallString<256U> *)local_8f0,local_900);
    std::__cxx11::string::~string((string *)&local_920);
    llvm::Twine::Twine(&local_938,"manifest.llbuild");
    llvm::Twine::Twine(&local_950,"");
    llvm::Twine::Twine(&local_968,"");
    llvm::Twine::Twine((Twine *)&ec._M_cat,"");
    llvm::sys::path::append
              ((SmallVectorImpl<char> *)local_8f0,&local_938,&local_950,&local_968,
               (Twine *)&ec._M_cat);
    std::error_code::error_code((error_code *)&os.SupportsSeeking);
    join_0x00000010_0x00000000_ =
         llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_8f0);
    llvm::raw_fd_ostream::raw_fd_ostream
              ((raw_fd_ostream *)local_9e0,join_0x00000010_0x00000000_,
               (error_code *)&os.SupportsSeeking,F_Text);
    bVar1 = std::error_code::operator_cast_to_bool((error_code *)&os.SupportsSeeking);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!ec",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                    ,0x524,
                    "virtual void BuildSystemTaskTests_dirContentsHandleUpstreamFailure_Test::TestBody()"
                   );
    }
    prVar7 = llvm::raw_ostream::operator<<
                       ((raw_ostream *)local_9e0,
                        "client:\n  name: mock\n\ntargets:\n  \"\": [\"<all>\"]\n\nnodes:\n  \"");
    prVar7 = llvm::raw_ostream::operator<<(prVar7,(SmallVectorImpl<char> *)local_4c0);
    prVar7 = llvm::raw_ostream::operator<<
                       (prVar7,
                        "\": {}\n\ncommands:\n  \"mkdir-output\":\n    tool: mkdir\n    outputs: [\""
                       );
    prVar7 = llvm::raw_ostream::operator<<(prVar7,(SmallVectorImpl<char> *)local_4c0);
    prVar7 = llvm::raw_ostream::operator<<
                       (prVar7,
                        "\"]\n    description: \"mkdir-output\"\n  \"<all>\":\n    tool: phony\n    inputs: [\""
                       );
    prVar7 = llvm::raw_ostream::operator<<(prVar7,(SmallVectorImpl<char> *)local_4c0);
    llvm::raw_ostream::operator<<(prVar7,"/\"]\n    outputs: [\"<all>\"]\n");
    llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)local_9e0);
    pcVar6 = (char *)strlen("");
    name.Length = (size_t)pcVar6;
    name.Data = pcVar6;
    llbuild::buildsystem::BuildKey::makeTarget((BuildKey *)local_a10,(BuildKey *)0x3783ba,name);
    llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system,false);
    llbuild::basic::createLocalFileSystem();
    llbuild::buildsystem::BuildSystem::BuildSystem
              (&local_aa8,(BuildSystemDelegate *)&system,&local_ab0);
    std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
    ~unique_ptr(&local_ab0);
    pcVar6 = llvm::SmallString<256U>::c_str((SmallString<256U> *)local_300);
    _auStack_ac0 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      strlen(pcVar6);
    }
    llbuild::buildsystem::BuildSystem::attachDB(&local_aa8,_auStack_ac0,(string *)0x0);
    join_0x00000010_0x00000000_ =
         llvm::SmallString::operator_cast_to_StringRef((SmallString *)local_8f0);
    local_ac1 = llbuild::buildsystem::BuildSystem::loadDescription
                          (&local_aa8,join_0x00000010_0x00000000_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_ae8,&local_ac1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ae8);
    if (!bVar1) {
      testing::Message::Message(&local_af0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&result.Storage.hasVal,(internal *)local_ae8,
                 (AssertionResult *)"loadingResult","false","true",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_af8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                 ,0x541,pcVar6);
      testing::internal::AssertHelper::operator=(&local_af8,&local_af0);
      testing::internal::AssertHelper::~AssertHelper(&local_af8);
      std::__cxx11::string::~string((string *)&result.Storage.hasVal);
      testing::Message::~Message(&local_af0);
    }
    manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].
    super_AlignedCharArray<1UL,_1UL>.buffer[0] =
         (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_ae8);
    if (manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
        _252_4_ == 0) {
      llbuild::buildsystem::BuildKey::BuildKey
                ((BuildKey *)&gtest_ar__2.message_,(BuildKey *)local_a10);
      llbuild::buildsystem::BuildSystem::build
                ((Optional<llbuild::buildsystem::BuildValue> *)local_b90,&local_aa8,
                 (BuildKey *)&gtest_ar__2.message_);
      llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)&gtest_ar__2.message_);
      local_bc1 = llvm::Optional<llbuild::buildsystem::BuildValue>::hasValue
                            ((Optional<llbuild::buildsystem::BuildValue> *)local_b90);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_bc0,&local_bc1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc0);
      if (!bVar1) {
        testing::Message::Message(&local_bd0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_bf8,(internal *)local_bc0,(AssertionResult *)"result.hasValue()",
                   "false","true",in_R9);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_bd8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x545,pcVar6);
        testing::internal::AssertHelper::operator=(&local_bd8,&local_bd0);
        testing::internal::AssertHelper::~AssertHelper(&local_bd8);
        std::__cxx11::string::~string((string *)local_bf8);
        testing::Message::~Message(&local_bd0);
      }
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] =
           (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc0);
      if (manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
          _252_4_ == 0) {
        __range1_3._7_1_ = 0;
        llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1_3,(MockBuildSystemDelegate *)&system);
        __end1_3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&__begin1_3);
        message.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__begin1_3);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end1_3,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)((long)&message.field_2 + 8)), bVar1) {
          pbVar8 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end1_3);
          std::__cxx11::string::string((string *)&gtest_ar__3.message_,(string *)pbVar8);
          lVar9 = std::__cxx11::string::find((char *)&gtest_ar__3.message_,0x362c62);
          if (lVar9 == -1) {
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xfc].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xfd].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xfe].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xff].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          }
          else {
            __range1_3._7_1_ = 1;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xfc].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x8;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xfd].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xfe].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
            manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
            [0xff].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          }
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          if (manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
              ._252_4_ != 0) goto LAB_00133a72;
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end1_3);
        }
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x8;
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
LAB_00133a72:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__begin1_3);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_c60,(bool *)((long)&__range1_3 + 7),(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c60);
        if (!bVar1) {
          testing::Message::Message(&local_c68);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_c90,(internal *)local_c60,(AssertionResult *)0x37f789,"false","true",
                     in_R9);
          pcVar6 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_c70,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                     ,0x54f,pcVar6);
          testing::internal::AssertHelper::operator=(&local_c70,&local_c68);
          testing::internal::AssertHelper::~AssertHelper(&local_c70);
          std::__cxx11::string::~string((string *)&local_c90);
          testing::Message::~Message(&local_c68);
        }
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc]
        .super_AlignedCharArray<1UL,_1UL>.buffer[0] =
             (AlignedCharArray<1UL,_1UL>)(AlignedCharArray<1UL,_1UL>)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_c60);
        if (manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
            _252_4_ == 0) {
          manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
          [0xfc].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
          [0xfd].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
          [0xfe].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
          manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts
          [0xff].super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
        }
      }
      llvm::Optional<llbuild::buildsystem::BuildValue>::~Optional
                ((Optional<llbuild::buildsystem::BuildValue> *)local_b90);
    }
    llbuild::buildsystem::BuildSystem::~BuildSystem(&local_aa8);
    llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
              ((MockBuildSystemDelegate *)&system);
    llbuild::buildsystem::BuildKey::~BuildKey((BuildKey *)local_a10);
    llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_8f0);
    if (manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts.
        _252_4_ == 0) {
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfc].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfd].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xfe].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
      manifest.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts[0xff].
      super_AlignedCharArray<1UL,_1UL>.buffer[0] = (AlignedCharArray<1UL,_1UL>)0x0;
    }
  }
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_680);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_4c0);
  llvm::SmallString<256U>::~SmallString((SmallString<256U> *)local_300);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr((unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
               *)(builddb.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                  InlineElts + 0xf8));
  llbuild::TmpDir::~TmpDir((TmpDir *)local_1d8);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, dirContentsHandleUpstreamFailure) {
  TmpDir tempDir(__func__);
  auto localFS = createLocalFileSystem();

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");
  for (auto& c : builddb) {
    if (c == '\\')
      c = '/';
  }

  SmallString<256> outputDir{ tempDir.str() };
  sys::path::append(outputDir, "output");
  for (auto& c : outputDir) {
    if (c == '\\')
      c = '/';
  }
  SmallString<256> fakeDir{ tempDir.str() };
  sys::path::append(fakeDir, "fake");
  for (auto& c : fakeDir) {
    if (c == '\\')
      c = '/';
  }

  // Write `output` as a symlink to something that doesn't exist
  ASSERT_TRUE(localFS->createSymlink(fakeDir.str(), outputDir.str()));

  // Build with a mkdir rule
  {
    SmallString<256> manifest{ tempDir.str() };
    sys::path::append(manifest, "manifest.llbuild");
    {
      std::error_code ec;
      llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
      assert(!ec);

      os <<
      "client:\n"
      "  name: mock\n"
      "\n"
      "targets:\n"
      "  \"\": [\"<all>\"]\n"
      "\n"
      "nodes:\n"
      "  \"" << outputDir << "\": {}\n"
      "\n"
      "commands:\n"
      "  \"mkdir-output\":\n"
      "    tool: mkdir\n"
      "    outputs: [\"" << outputDir << "\"]\n"
      "    description: \"mkdir-output\"\n"
      "  \"<all>\":\n"
      "    tool: phony\n"
      "    inputs: [\"" << outputDir << "/\"]\n"
      "    outputs: [\"<all>\"]\n";
    }

    // Create the build system.
    auto keyToBuild = BuildKey::makeTarget("");
    MockBuildSystemDelegate delegate;
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);
    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    // Build a specific key.
    auto result = system.build(keyToBuild);
    ASSERT_TRUE(result.hasValue());

    // Ensure that we have not had any missing inputs
    bool found = false;
    for (auto message : delegate.getMessages()) {
      if (message.find("unable to create directory") != std::string::npos) {
        found = true;
        break;
      }
    }
    ASSERT_TRUE(found);
  }
}